

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O3

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/array_object.cpp:645:59)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:645:59)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  bool bVar1;
  uint32_t uVar2;
  long *plVar3;
  undefined8 *puVar4;
  object *poVar5;
  uint *puVar6;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar7;
  pointer pvVar8;
  uint uVar9;
  ulong uVar10;
  _Alloc_hider this_00;
  double dVar11;
  wstring is;
  object_ptr o;
  value search_element;
  gc_heap *local_e0;
  wstring local_d8;
  wstring_view local_b8;
  gc_heap_ptr_untyped local_a8;
  value local_98;
  value *local_70;
  gc_heap_ptr_untyped *local_68;
  gc_heap_ptr_untyped *local_60;
  value local_58;
  
  local_70 = __return_storage_ptr__;
  plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->f);
  (**(code **)(*plVar3 + 0x88))(&local_a8,plVar3,this_);
  puVar4 = (undefined8 *)gc_heap_ptr_untyped::get(&local_a8);
  local_58._0_8_ = 6;
  local_58.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)0x1b0488;
  (**(code **)*puVar4)(&local_98,puVar4);
  uVar2 = to_uint32(&local_98);
  value::destroy(&local_98);
  if (uVar2 == 0) {
    local_e0 = (gc_heap *)0xbff0000000000000;
    goto LAB_001414b6;
  }
  pvVar8 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
      super__Vector_impl_data._M_finish == pvVar8) {
    pvVar8 = (pointer)&value::undefined;
  }
  value::value(&local_98,pvVar8);
  local_e0 = (gc_heap *)0xbff0000000000000;
  if ((local_98.type_ != number) || (!NAN(local_98.field_1.n_))) {
    pvVar8 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar11 = 0.0;
    uVar7 = extraout_RDX;
    if ((ulong)(((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)pvVar8 >> 3) * -0x3333333333333333)
        < 2) {
LAB_001412c5:
      uVar10 = (ulong)dVar11;
    }
    else {
      dVar11 = to_integer(pvVar8 + 1);
      if ((double)uVar2 <= dVar11) goto LAB_001414ac;
      uVar7 = extraout_RDX_00;
      if (0.0 <= dVar11) goto LAB_001412c5;
      dVar11 = (double)uVar2 - ABS(dVar11);
      uVar10 = 0;
      if (0.0 <= dVar11) {
        uVar10 = (ulong)dVar11;
      }
    }
    if (uVar2 < 0x10000) {
      if ((uint)uVar10 < uVar2) {
        do {
          index_string_abi_cxx11_(&local_d8,(mjs *)(uVar10 & 0xffffffff),(uint32_t)uVar7);
          poVar5 = (object *)gc_heap_ptr_untyped::get(&local_a8);
          local_b8._M_len = local_d8._M_string_length;
          local_b8._M_str = local_d8._M_dataplus._M_p;
          bVar1 = object::has_property(poVar5,&local_b8);
          if (bVar1) {
            puVar4 = (undefined8 *)gc_heap_ptr_untyped::get(&local_a8);
            local_68 = (gc_heap_ptr_untyped *)local_d8._M_string_length;
            local_60 = (gc_heap_ptr_untyped *)local_d8._M_dataplus._M_p;
            (**(code **)*puVar4)(&local_58,puVar4,&local_68);
            bVar1 = operator==(&local_58,&local_98);
            value::destroy(&local_58);
            uVar7 = extraout_RDX_02;
          }
          else {
            bVar1 = false;
            uVar7 = extraout_RDX_01;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity * 4 + 4
                           );
            uVar7 = extraout_RDX_03;
          }
          if (bVar1 != false) {
            local_e0 = (gc_heap *)(double)(uVar10 & 0xffffffff);
            break;
          }
          uVar9 = (int)uVar10 + 1;
          uVar10 = (ulong)uVar9;
        } while (uVar2 != uVar9);
      }
    }
    else {
      poVar5 = (object *)gc_heap_ptr_untyped::get(&local_a8);
      object::enumerable_property_names
                ((vector<mjs::string,_std::allocator<mjs::string>_> *)&local_d8,poVar5);
      if (local_d8._M_dataplus._M_p != (pointer)local_d8._M_string_length) {
        this_00._M_p = local_d8._M_dataplus._M_p;
        do {
          puVar6 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_00._M_p);
          local_58.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
               (gc_heap *)(puVar6 + 1);
          local_58._0_8_ = ZEXT48(*puVar6);
          uVar2 = index_value_from_string((wstring_view *)&local_58);
          if ((uVar2 != 0xffffffff) && ((uint)uVar10 <= uVar2)) {
            puVar4 = (undefined8 *)gc_heap_ptr_untyped::get(&local_a8);
            puVar6 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_00._M_p);
            local_b8._M_str = (wchar_t *)(puVar6 + 1);
            local_b8._M_len = (size_t)*puVar6;
            (**(code **)*puVar4)(&local_58,puVar4,&local_b8);
            bVar1 = operator==(&local_58,&local_98);
            value::destroy(&local_58);
            if (bVar1) {
              local_e0 = (gc_heap *)(double)uVar2;
              break;
            }
          }
          this_00._M_p = this_00._M_p + 0x10;
        } while (this_00._M_p != (pointer)local_d8._M_string_length);
      }
      std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector
                ((vector<mjs::string,_std::allocator<mjs::string>_> *)&local_d8);
    }
  }
LAB_001414ac:
  value::destroy(&local_98);
LAB_001414b6:
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a8);
  local_70->type_ = number;
  (local_70->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       local_e0;
  return local_70;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }